

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTConstantExpression.cpp
# Opt level: O1

void __thiscall
MathML::AST::ConstantExpression::ConstantExpression(ConstantExpression *this,double val)

{
  (this->super_INode)._vptr_INode = (_func_int **)&PTR__ConstantExpression_009e2bc0;
  (this->mStringValue)._M_dataplus._M_p = (pointer)&(this->mStringValue).field_2;
  (this->mStringValue)._M_string_length = 0;
  (this->mStringValue).field_2._M_local_buf[0] = '\0';
  this->mType = SCALAR_DOUBLE;
  this->mValue = val;
  return;
}

Assistant:

ConstantExpression::ConstantExpression( double val )
        {
            setValue( val );
        }